

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcre.cc
# Opt level: O3

bool re2::PCRE::Extract(StringPiece *text,PCRE *pattern,StringPiece *rewrite,string *out)

{
  bool bVar1;
  int veclen;
  int startpos;
  StringPiece *text_00;
  int *in_R9;
  int vec [51];
  int local_f8 [52];
  
  bVar1 = false;
  text_00 = (StringPiece *)0x0;
  memset(local_f8,0,0xcc);
  veclen = TryMatch(pattern,text_00,startpos,UNANCHORED,false,in_R9,0x33);
  if (veclen != 0) {
    out->_M_string_length = 0;
    *(out->_M_dataplus)._M_p = '\0';
    bVar1 = Rewrite(pattern,out,rewrite,text,local_f8,veclen);
  }
  return bVar1;
}

Assistant:

bool PCRE::Extract(const StringPiece &text,
                 const PCRE& pattern,
                 const StringPiece &rewrite,
                 string *out) {
  int vec[kVecSize] = {};
  int matches = pattern.TryMatch(text, 0, UNANCHORED, true, vec, kVecSize);
  if (matches == 0)
    return false;
  out->clear();
  return pattern.Rewrite(out, rewrite, text, vec, matches);
}